

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

int __thiscall
embree::ExtObjMaterial::select
          (ExtObjMaterial *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  float Ns;
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined4 uVar6;
  MetallicPaintMaterial *pMVar7;
  ThinDielectricMaterial *this_00;
  MatteMaterial *this_01;
  MetalMaterial *pMVar8;
  OBJMaterial *pOVar9;
  undefined4 in_register_00000034;
  uint *puVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  shared_ptr<embree::Texture> nulltex;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  puVar10 = (uint *)CONCAT44(in_register_00000034,__nfds);
  nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = *puVar10;
  if (4 < (ulong)uVar2) {
    this_01 = (MatteMaterial *)SceneGraph::MaterialNode::operator_new(0x90);
    local_158._8_8_ = 0x3f0000003f000000;
    local_158._0_8_ = 0x3f0000003f000000;
    MatteMaterial::MatteMaterial(this_01,(Vec3fa *)&local_158.field_1);
    *(MatteMaterial **)this = this_01;
    (*(this_01->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_01);
    goto LAB_00136fa4;
  }
  switch(uVar2) {
  case 0:
    pOVar9 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
    fVar1 = (float)puVar10[2];
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x18));
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x1c));
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x20));
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x24));
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x28));
    Ns = (float)puVar10[3];
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x2c));
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x30));
    OBJMaterial::OBJMaterial
              (pOVar9,fVar1,(shared_ptr<embree::Texture> *)&local_80,(Vec3fa *)(puVar10 + 8),
               (shared_ptr<embree::Texture> *)&local_90,(Vec3fa *)(puVar10 + 0xc),
               (shared_ptr<embree::Texture> *)&local_a0,(Vec3fa *)(puVar10 + 0x10),
               (shared_ptr<embree::Texture> *)&local_b0,(Vec3fa *)(puVar10 + 0x14),
               (shared_ptr<embree::Texture> *)&local_c0,Ns,(shared_ptr<embree::Texture> *)&local_40,
               (shared_ptr<embree::Texture> *)&local_50);
    *(OBJMaterial **)this = pOVar9;
    (*(pOVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar9);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    p_Var5 = &local_80;
    break;
  case 1:
    if (((float)puVar10[0x3a] != 1.0) || (NAN((float)puVar10[0x3a]))) {
      pMVar7 = (MetallicPaintMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
      local_158 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
      MetallicPaintMaterial::MetallicPaintMaterial
                (pMVar7,(Vec3fa *)(puVar10 + 0xc),(Vec3fa *)&local_158.field_1,0.0,
                 (float)puVar10[0x41]);
      *(MetallicPaintMaterial **)this = pMVar7;
      (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar7);
      goto LAB_00136fa4;
    }
    pOVar9 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    local_158 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 0x20));
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_100,&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    local_148 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_110,&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    fVar1 = (float)puVar10[0x34];
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    OBJMaterial::OBJMaterial
              (pOVar9,1.0,(shared_ptr<embree::Texture> *)&local_d0,(Vec3fa *)&local_158.field_1,
               (shared_ptr<embree::Texture> *)&local_e0,(Vec3fa *)(puVar10 + 0xc),
               (shared_ptr<embree::Texture> *)&local_f0,(Vec3fa *)(puVar10 + 0x10),
               (shared_ptr<embree::Texture> *)&local_100,(Vec3fa *)&local_148.field_1,
               (shared_ptr<embree::Texture> *)&local_110,1.0 / (fVar1 + 1e-06),
               (shared_ptr<embree::Texture> *)&local_60,(shared_ptr<embree::Texture> *)&local_70);
    *(OBJMaterial **)this = pOVar9;
    (*(pOVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar9);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    p_Var5 = &local_d0;
    break;
  case 2:
    this_00 = (ThinDielectricMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
    local_158._8_8_ = 0x3f8000003f800000;
    local_158._0_8_ = 0x3f8000003f800000;
    ThinDielectricMaterial::ThinDielectricMaterial
              (this_00,(Vec3fa *)&local_158.field_1,(float)puVar10[0x41],0.1);
    *(ThinDielectricMaterial **)this = this_00;
    (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
    goto LAB_00136fa4;
  case 3:
    if (((float)puVar10[0x34] != 0.0) || (NAN((float)puVar10[0x34]))) {
      pMVar8 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xc0);
      local_158.m128[3] = 0.0;
      local_158.field_1 =
           (anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1)
           *(undefined1 (*) [12])(puVar10 + 0x41);
      local_148.m128[2] = (float)(int)((ulong)*(undefined8 *)(puVar10 + 0x45) >> 0x20);
      local_148._0_8_ = *(undefined8 *)(puVar10 + 0x44);
      local_148.m128[3] = 0.0;
      MetalMaterial::MetalMaterial
                (pMVar8,(Vec3fa *)(puVar10 + 0xc),(Vec3fa *)&local_158.field_1,
                 (Vec3fa *)&local_148.field_1,(float)puVar10[0x34]);
      *(MetalMaterial **)this = pMVar8;
      (*(pMVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar8);
      goto LAB_00136fa4;
    }
    auVar4._4_4_ = -(uint)((float)puVar10[0x42] == 1.0);
    auVar4._0_4_ = -(uint)((float)puVar10[0x41] == 1.0);
    auVar4._8_4_ = -(uint)((float)puVar10[0x43] == 1.0);
    auVar4._12_4_ = 0;
    uVar6 = movmskps((&switchD_001369e9::switchdataD_0021dab8)[uVar2] + 0x21dab8,auVar4);
    if (((~(byte)uVar6 & 7) != 0) ||
       (auVar3._4_4_ = -(uint)((float)*(undefined8 *)(puVar10 + 0x45) == 0.0),
       auVar3._0_4_ = -(uint)((float)puVar10[0x44] == 0.0),
       auVar3._8_4_ = -(uint)((float)((ulong)*(undefined8 *)(puVar10 + 0x45) >> 0x20) == 0.0),
       auVar3._12_4_ = 0xffffffff,
       uVar6 = movmskps(CONCAT31((int3)((uint)uVar6 >> 8),~(byte)uVar6),auVar3),
       (~(byte)uVar6 & 7) != 0)) {
      pMVar8 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xc0);
      local_158.m128[3] = 0.0;
      local_158.field_1 =
           (anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1)
           *(undefined1 (*) [12])(puVar10 + 0x41);
      local_148.m128[2] = (float)(int)((ulong)*(undefined8 *)(puVar10 + 0x45) >> 0x20);
      local_148._0_8_ = *(undefined8 *)(puVar10 + 0x44);
      local_148.m128[3] = 0.0;
      MetalMaterial::MetalMaterial
                (pMVar8,(Vec3fa *)(puVar10 + 0xc),(Vec3fa *)&local_158.field_1,
                 (Vec3fa *)&local_148.field_1);
      *(MetalMaterial **)this = pMVar8;
      (*(pMVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar8);
      goto LAB_00136fa4;
    }
    pMVar7 = (MetallicPaintMaterial *)SceneGraph::MaterialNode::operator_new(0x90);
    MirrorMaterial::MirrorMaterial((MirrorMaterial *)pMVar7,(Vec3fa *)(puVar10 + 0xc));
    goto LAB_00136bb4;
  case 4:
    pMVar7 = (MetallicPaintMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
    MetallicPaintMaterial::MetallicPaintMaterial
              (pMVar7,(Vec3fa *)(puVar10 + 0xc),(Vec3fa *)(puVar10 + 0x10),0.0,(float)puVar10[0x3a])
    ;
LAB_00136bb4:
    *(MetallicPaintMaterial **)this = pMVar7;
    (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar7);
    goto LAB_00136fa4;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var5->_M_refcount);
LAB_00136fa4:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nulltex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (int)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> select() const 
    {
      std::shared_ptr<Texture> nulltex;
      if (type == NONE) {
        return new OBJMaterial(d,map_d,Ka,map_Ka,Kd,map_Kd,Ks,map_Ks,Kt,map_Kt,Ns,map_Ns,map_Displ);
      } else if (type == MATTE) {
        if (coat_eta != 1.0f) return new MetallicPaintMaterial (Kd,zero,0.0f,eta.x);
        else                  return new OBJMaterial(1.0f,nulltex,zero,nulltex,Kd,map_Kd,Ks,nulltex,zero,nulltex,1.0f/(1E-6f+roughness),nulltex,nulltex);
      } else if (type == GLASS) {
        return new ThinDielectricMaterial(Vec3fa(1.0f),eta.x,0.1f);
      } else if (type == METAL) {
        if (roughness == 0.0f) {
          if (eta == Vec3fa(1.0f) && k == Vec3fa(0.0f)) return new MirrorMaterial(Kd);
          else                                          return new MetalMaterial(Kd,eta,k);
        }
        else return new MetalMaterial(Kd,eta,k,roughness);
      } else if (type == METALLIC_PAINT) {
        return new MetallicPaintMaterial (Kd,Ks,0.0f,coat_eta);
      }
      return new MatteMaterial(Vec3fa(0.5f));
    }